

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O3

sub_channel_info *
idx2::BinarySearch<idx2::sub_channel_info,idx2::sub_channel_info*>
          (sub_channel_info *Beg,sub_channel_info *End,sub_channel_info *Val)

{
  sub_channel_info *psVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  
  cVar2 = Val->Level;
  do {
    if (End <= Beg) {
      return End;
    }
    while( true ) {
      psVar1 = (sub_channel_info *)
               (&Beg->Level +
               (((long)End - (long)Beg >> 4) - ((long)End - (long)Beg >> 0x3f) & 0xfffffffffffffffeU
               ) * 8);
      cVar3 = psVar1->Level;
      bVar4 = cVar2 < cVar3;
      if (cVar3 == cVar2) {
        bVar4 = psVar1->Subband < Val->Subband;
      }
      if (!bVar4) break;
      Beg = psVar1 + 1;
      if (End <= Beg) {
        return End;
      }
    }
    bVar4 = cVar3 < cVar2;
    if (cVar2 == cVar3) {
      bVar4 = Val->Subband < psVar1->Subband;
    }
    End = psVar1;
  } while (bVar4);
  return psVar1;
}

Assistant:

i
BinarySearch(i Beg, i End, const t& Val)
{
  while (Beg < End)
  {
    i Mid = Beg + (End - Beg) / 2;
    if (*Mid < Val)
    {
      Beg = Mid + 1;
      continue;
    }
    else if (Val < *Mid)
    {
      End = Mid;
      continue;
    }
    return Mid;
  }
  return End;
}